

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O0

void __thiscall Fl_Window::label(Fl_Window *this,char *name,char *iname)

{
  int iVar1;
  Fl_Group *pFVar2;
  size_t sVar3;
  size_t sVar4;
  int inamelen;
  int namelen;
  char *iname_local;
  char *name_local;
  Fl_Window *this_local;
  
  Fl_Widget::label((Fl_Widget *)this,name);
  this->iconlabel_ = iname;
  iVar1 = shown(this);
  if (iVar1 != 0) {
    pFVar2 = Fl_Widget::parent((Fl_Widget *)this);
    if (pFVar2 == (Fl_Group *)0x0) {
      iname_local = name;
      if (name == (char *)0x0) {
        iname_local = "";
      }
      sVar3 = strlen(iname_local);
      _inamelen = iname;
      if (iname == (char *)0x0) {
        _inamelen = fl_filename_name(iname_local);
      }
      sVar4 = strlen(_inamelen);
      XChangeProperty(fl_display,this->i->xid,fl_NET_WM_NAME,fl_XaUtf8String,8,0,iname_local,
                      (int)sVar3);
      XChangeProperty(fl_display,this->i->xid,0x27,0x1f,8,0,iname_local,(int)sVar3);
      XChangeProperty(fl_display,this->i->xid,fl_NET_WM_ICON_NAME,fl_XaUtf8String,8,0,_inamelen,
                      (int)sVar4);
      XChangeProperty(fl_display,this->i->xid,0x25,0x1f,8,0,_inamelen,(int)sVar4);
    }
  }
  return;
}

Assistant:

void Fl_Window::label(const char *name,const char *iname) {
  Fl_Widget::label(name);
  iconlabel_ = iname;
  if (shown() && !parent()) {
    if (!name) name = "";
    int namelen = strlen(name);
    if (!iname) iname = fl_filename_name(name);
    int inamelen = strlen(iname);
    XChangeProperty(fl_display, i->xid, fl_NET_WM_NAME,      fl_XaUtf8String, 8, 0, (uchar*)name,  namelen);	// utf8
    XChangeProperty(fl_display, i->xid, XA_WM_NAME,          XA_STRING,       8, 0, (uchar*)name,  namelen);	// non-utf8
    XChangeProperty(fl_display, i->xid, fl_NET_WM_ICON_NAME, fl_XaUtf8String, 8, 0, (uchar*)iname, inamelen);	// utf8
    XChangeProperty(fl_display, i->xid, XA_WM_ICON_NAME,     XA_STRING,       8, 0, (uchar*)iname, inamelen);	// non-utf8
  }
}